

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O1

void __thiscall wasm::WasmBinaryWriter::writeType(WasmBinaryWriter *this,Type type)

{
  Shareability SVar1;
  BasicHeapType BVar2;
  uint uVar3;
  Exactness exactness;
  HeapType type_00;
  undefined8 uVar4;
  uint *__n;
  void *in_RDX;
  undefined8 extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  int __fd;
  HeapType *this_00;
  char *__assertion;
  bool bVar5;
  HeapType local_38;
  HeapType heapType;
  Type type_local;
  
  heapType.id = type.id;
  if ((type.id & 1) != 0 || type.id < 7) {
    bVar5 = (type.id & 1) == 0;
    __n = (uint *)(CONCAT71((int7)(type.id >> 8),bVar5 || type.id < 7) & 0xffffffff);
    if (!bVar5 && type.id >= 7) {
      __assertion = "!type.isTuple() && \"Unexpected tuple type\"";
LAB_00c75f06:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                    ,0x674,"void wasm::WasmBinaryWriter::writeType(Type)");
    }
    if (6 < type.id) {
      __assertion = "type.isBasic() && \"TODO: handle compound types\"";
      goto LAB_00c75f06;
    }
    if ((0x7dU >> ((uint)type.id & 0x1f) & 1) == 0) {
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                         ,0x68a);
    }
    __fd = (int)this->o;
    this_00 = &local_38;
    local_38.id._0_4_ = *(undefined4 *)(&DAT_00e4e1c0 + type.id * 4);
    goto LAB_00c75cd0;
  }
  if (((this->wasm->features).features & 0x400) == 0) {
    local_38 = wasm::Type::getHeapType((Type *)&heapType);
    if (((uint)local_38.id & 0x7b) == 0x50 && local_38.id < 0x7d) {
      SVar1 = HeapType::getShared(&local_38);
      heapType.id = (ulong)(SVar1 == Shared) * 4 + 0x52;
    }
    else {
      type_local.id = (uintptr_t)wasm::Type::getHeapType((Type *)&heapType);
      BVar2 = HeapType::getTop((HeapType *)&type_local);
      if (((uint)(0x7c < BVar2) * 4 + 3 & BVar2) != 0) {
        __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                      ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
      }
      heapType.id = (ulong)BVar2 | 2;
    }
  }
  local_38 = wasm::Type::getHeapType((Type *)&heapType);
  __buf = (void *)CONCAT71((int7)((ulong)extraout_RDX >> 8),6 < heapType.id);
  uVar4 = 0;
  if (((local_38.id < 0x7d && 6 < heapType.id) && ((uint)heapType.id & 3) == 2) &&
     (SVar1 = HeapType::getShared(&local_38), __buf = extraout_RDX_00, SVar1 != Shared)) {
    if (0x7c < local_38.id) {
      __assert_fail("isBasic()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                    ,0xe2,"BasicHeapType wasm::HeapType::getBasic(Shareability) const");
    }
    uVar3 = (uint)local_38.id & 0x7b;
    __n = &switchD_00c75d79::switchdataD_00e4d2e0;
    in_RDX = extraout_RDX_00;
    switch(uVar3 << 0x1d | uVar3 - 8 >> 3) {
    case 0:
      __fd = (int)this->o;
      this_00 = (HeapType *)&type_local;
      type_local.id._0_4_ = 0xffffffef;
      break;
    case 1:
      __fd = (int)this->o;
      this_00 = (HeapType *)&type_local;
      type_local.id._0_4_ = 0xfffffff0;
      break;
    case 2:
      __fd = (int)this->o;
      this_00 = (HeapType *)&type_local;
      type_local.id._0_4_ = 0xffffffe8;
      break;
    case 3:
      __fd = (int)this->o;
      this_00 = (HeapType *)&type_local;
      type_local.id._0_4_ = 0xffffffee;
      break;
    case 4:
      __fd = (int)this->o;
      this_00 = (HeapType *)&type_local;
      type_local.id._0_4_ = 0xffffffed;
      break;
    case 5:
      __fd = (int)this->o;
      this_00 = (HeapType *)&type_local;
      type_local.id._0_4_ = 0xffffffec;
      break;
    case 6:
      __fd = (int)this->o;
      this_00 = (HeapType *)&type_local;
      type_local.id._0_4_ = 0xffffffeb;
      break;
    case 7:
      __fd = (int)this->o;
      this_00 = (HeapType *)&type_local;
      type_local.id._0_4_ = 0xffffffea;
      break;
    case 8:
      __fd = (int)this->o;
      this_00 = (HeapType *)&type_local;
      type_local.id._0_4_ = 0xffffffe9;
      break;
    case 9:
      __fd = (int)this->o;
      this_00 = (HeapType *)&type_local;
      type_local.id._0_4_ = 0xffffffe7;
      break;
    case 10:
      __fd = (int)this->o;
      this_00 = (HeapType *)&type_local;
      type_local.id._0_4_ = 0xfffffff1;
      break;
    case 0xb:
      __fd = (int)this->o;
      this_00 = (HeapType *)&type_local;
      type_local.id._0_4_ = 0xfffffff2;
      break;
    case 0xc:
      __fd = (int)this->o;
      this_00 = (HeapType *)&type_local;
      type_local.id._0_4_ = 0xfffffff3;
      break;
    case 0xd:
      __fd = (int)this->o;
      this_00 = (HeapType *)&type_local;
      type_local.id._0_4_ = 0xfffffff5;
      break;
    case 0xe:
      __fd = (int)this->o;
      this_00 = (HeapType *)&type_local;
      type_local.id._0_4_ = 0xfffffff4;
      break;
    default:
      goto switchD_00c75d79_default;
    }
LAB_00c75cd0:
    LEB<int,_signed_char>::write((LEB<int,_signed_char> *)this_00,__fd,in_RDX,(size_t)__n);
  }
  else {
switchD_00c75d79_default:
    if (((uint)heapType.id & 3) != 2 || heapType.id < 7) {
      type_local.id._0_4_ = 0xffffffe4;
    }
    else {
      type_local.id._0_4_ = 0xffffffe3;
    }
    LEB<int,_signed_char>::write
              ((LEB<int,_signed_char> *)&type_local,(int)this->o,__buf,
               CONCAT71((int7)((ulong)uVar4 >> 8),heapType.id < 7));
    type_00 = wasm::Type::getHeapType((Type *)&heapType);
    exactness = wasm::Type::getExactness((Type *)&heapType);
    writeHeapType(this,type_00,exactness);
  }
  return;
}

Assistant:

void WasmBinaryWriter::writeType(Type type) {
  if (type.isRef()) {
    // The only reference types allowed without GC are funcref, externref, and
    // exnref. We internally use more refined versions of those types, but we
    // cannot emit those without GC.
    if (!wasm->features.hasGC()) {
      auto ht = type.getHeapType();
      if (ht.isMaybeShared(HeapType::string)) {
        // Do not overgeneralize stringref to anyref. We have tests that when a
        // stringref is expected, we actually get a stringref. If we see a
        // string, the stringref feature must be enabled.
        type = Type(HeapTypes::string.getBasic(ht.getShared()), Nullable);
      } else {
        // Only the top type (func, extern, exn) is available, and only the
        // nullable version.
        type = Type(type.getHeapType().getTop(), Nullable);
      }
    }
    auto heapType = type.getHeapType();
    if (type.isNullable() && heapType.isBasic() && !heapType.isShared()) {
      switch (heapType.getBasic(Unshared)) {
        case HeapType::ext:
          o << S32LEB(BinaryConsts::EncodedType::externref);
          return;
        case HeapType::any:
          o << S32LEB(BinaryConsts::EncodedType::anyref);
          return;
        case HeapType::func:
          o << S32LEB(BinaryConsts::EncodedType::funcref);
          return;
        case HeapType::cont:
          o << S32LEB(BinaryConsts::EncodedType::contref);
          return;
        case HeapType::eq:
          o << S32LEB(BinaryConsts::EncodedType::eqref);
          return;
        case HeapType::i31:
          o << S32LEB(BinaryConsts::EncodedType::i31ref);
          return;
        case HeapType::struct_:
          o << S32LEB(BinaryConsts::EncodedType::structref);
          return;
        case HeapType::array:
          o << S32LEB(BinaryConsts::EncodedType::arrayref);
          return;
        case HeapType::exn:
          o << S32LEB(BinaryConsts::EncodedType::exnref);
          return;
        case HeapType::string:
          o << S32LEB(BinaryConsts::EncodedType::stringref);
          return;
        case HeapType::none:
          o << S32LEB(BinaryConsts::EncodedType::nullref);
          return;
        case HeapType::noext:
          o << S32LEB(BinaryConsts::EncodedType::nullexternref);
          return;
        case HeapType::nofunc:
          o << S32LEB(BinaryConsts::EncodedType::nullfuncref);
          return;
        case HeapType::noexn:
          o << S32LEB(BinaryConsts::EncodedType::nullexnref);
          return;
        case HeapType::nocont:
          o << S32LEB(BinaryConsts::EncodedType::nullcontref);
          return;
      }
    }
    if (type.isNullable()) {
      o << S32LEB(BinaryConsts::EncodedType::nullable);
    } else {
      o << S32LEB(BinaryConsts::EncodedType::nonnullable);
    }
    writeHeapType(type.getHeapType(), type.getExactness());
    return;
  }
  int ret = 0;
  TODO_SINGLE_COMPOUND(type);
  switch (type.getBasic()) {
    // None only used for block signatures. TODO: Separate out?
    case Type::none:
      ret = BinaryConsts::EncodedType::Empty;
      break;
    case Type::i32:
      ret = BinaryConsts::EncodedType::i32;
      break;
    case Type::i64:
      ret = BinaryConsts::EncodedType::i64;
      break;
    case Type::f32:
      ret = BinaryConsts::EncodedType::f32;
      break;
    case Type::f64:
      ret = BinaryConsts::EncodedType::f64;
      break;
    case Type::v128:
      ret = BinaryConsts::EncodedType::v128;
      break;
    default:
      WASM_UNREACHABLE("unexpected type");
  }
  o << S32LEB(ret);
}